

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

IdList * sqlite3IdListDup(sqlite3 *db,IdList *p)

{
  IdList_item *pIVar1;
  long lVar2;
  char *pcVar3;
  long *in_RSI;
  IdList_item *pOldItem;
  IdList_item *pNewItem;
  int i;
  IdList *pNew;
  void *in_stack_ffffffffffffffc8;
  sqlite3 *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar4;
  IdList *local_8;
  
  if (in_RSI == (long *)0x0) {
    local_8 = (IdList *)0x0;
  }
  else {
    local_8 = (IdList *)
              sqlite3DbMallocRawNN
                        ((sqlite3 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         (u64)in_stack_ffffffffffffffd0);
    if (local_8 == (IdList *)0x0) {
      local_8 = (IdList *)0x0;
    }
    else {
      local_8->nId = (int)in_RSI[1];
      pIVar1 = (IdList_item *)
               sqlite3DbMallocRawNN
                         ((sqlite3 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          (u64)in_stack_ffffffffffffffd0);
      local_8->a = pIVar1;
      if (local_8->a == (IdList_item *)0x0) {
        sqlite3DbFreeNN(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        local_8 = (IdList *)0x0;
      }
      else {
        for (iVar4 = 0; iVar4 < (int)in_RSI[1]; iVar4 = iVar4 + 1) {
          pIVar1 = local_8->a + iVar4;
          lVar2 = *in_RSI + (long)iVar4 * 0x10;
          pcVar3 = sqlite3DbStrDup((sqlite3 *)CONCAT44(iVar4,in_stack_ffffffffffffffd8),
                                   (char *)pIVar1);
          pIVar1->zName = pcVar3;
          pIVar1->idx = *(int *)(lVar2 + 8);
        }
      }
    }
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListDup(sqlite3 *db, IdList *p){
  IdList *pNew;
  int i;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, sizeof(*pNew) );
  if( pNew==0 ) return 0;
  pNew->nId = p->nId;
  pNew->a = sqlite3DbMallocRawNN(db, p->nId*sizeof(p->a[0]) );
  if( pNew->a==0 ){
    sqlite3DbFreeNN(db, pNew);
    return 0;
  }
  /* Note that because the size of the allocation for p->a[] is not
  ** necessarily a power of two, sqlite3IdListAppend() may not be called
  ** on the duplicate created by this function. */
  for(i=0; i<p->nId; i++){
    struct IdList_item *pNewItem = &pNew->a[i];
    struct IdList_item *pOldItem = &p->a[i];
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->idx = pOldItem->idx;
  }
  return pNew;
}